

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_waiter.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::synchronization_internal::PthreadWaiter::PthreadWaiter(PthreadWaiter *this)

{
  uint __line;
  uint uVar1;
  char *pcVar2;
  
  this->waiter_count_ = 0;
  this->wakeup_count_ = 0;
  uVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (uVar1 == 0) {
    uVar1 = pthread_cond_init((pthread_cond_t *)&this->cv_,(pthread_condattr_t *)0x0);
    if (uVar1 == 0) {
      return;
    }
    pcVar2 = "pthread_cond_init failed: %d";
    __line = 0x49;
  }
  else {
    pcVar2 = "pthread_mutex_init failed: %d";
    __line = 0x44;
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"pthread_waiter.cc",__line,pcVar2,(ulong)uVar1);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/pthread_waiter.cc"
                ,__line,"absl::synchronization_internal::PthreadWaiter::PthreadWaiter()");
}

Assistant:

PthreadWaiter::PthreadWaiter() : waiter_count_(0), wakeup_count_(0) {
  const int err = pthread_mutex_init(&mu_, 0);
  if (err != 0) {
    ABSL_RAW_LOG(FATAL, "pthread_mutex_init failed: %d", err);
  }

  const int err2 = pthread_cond_init(&cv_, 0);
  if (err2 != 0) {
    ABSL_RAW_LOG(FATAL, "pthread_cond_init failed: %d", err2);
  }
}